

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int set_add(void *av,void *t)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  size_t __size;
  bool bVar6;
  AbstractVec vv;
  uint local_40 [2];
  void *local_38;
  
  do {
    uVar1 = *av;
    if (uVar1 == 0) {
      local_38 = (void *)0x0;
      *(undefined4 *)((long)av + 4) = 2;
    }
    else {
      bVar6 = false;
      uVar4 = (ulong)t & 0xffffffff;
      uVar5 = 0;
      do {
        uVar4 = uVar4 % (ulong)uVar1;
        pvVar3 = *(void **)(*(long *)((long)av + 8) + uVar4 * 8);
        if (pvVar3 == (void *)0x0) {
          *(void **)(*(long *)((long)av + 8) + uVar4 * 8) = t;
          iVar2 = 1;
          break;
        }
        iVar2 = 0;
        if (pvVar3 == t) break;
        uVar4 = (ulong)((int)uVar4 + 1);
        bVar6 = 3 < uVar5;
        uVar5 = uVar5 + 1;
        iVar2 = 0;
      } while (uVar5 != 5);
      if (!bVar6) {
        return iVar2;
      }
      local_38 = *(void **)((long)av + 8);
      *(int *)((long)av + 4) = *(int *)((long)av + 4) + 1;
      local_40[0] = uVar1;
    }
    uVar1 = d_prime2[*(uint *)((long)av + 4)];
    *(uint *)av = uVar1;
    __size = (ulong)uVar1 << 3;
    pvVar3 = malloc(__size);
    *(void **)((long)av + 8) = pvVar3;
    memset(pvVar3,0,__size);
    pvVar3 = local_38;
    if (local_38 != (void *)0x0) {
      set_union(av,local_40);
      free(pvVar3);
    }
  } while( true );
}

Assistant:

int set_add(void *av, void *t) {
  AbstractVec *v = (AbstractVec *)av, vv;
  int j, n = v->n;
  uint i;
  if (n) {
    uint h = ((uintptr_t)t);
    h = h % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = t;
        return 1;
      } else if (v->v[i] == t)
        return 0;
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = v->v;
    vv.n = v->n;
    v->i = v->i + 1;
  }
  v->n = d_prime2[v->i];
  v->v = (void **)MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union(av, &vv);
    FREE(vv.v);
  }
  return set_add(v, t);
}